

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O0

timestamp_t duckdb::Timestamp::FromCString(char *str,idx_t len,optional_ptr<int,_true> nanos)

{
  TimestampCastResult TVar1;
  undefined8 uVar2;
  string *msg;
  ulong in_RSI;
  ConversionException *in_RDI;
  timestamp_t result;
  string *in_stack_fffffffffffffe88;
  ConversionException *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffea8;
  timestamp_t *in_stack_fffffffffffffeb0;
  idx_t in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  allocator *paVar3;
  optional_ptr<int,_true> in_stack_fffffffffffffec8;
  allocator local_109;
  string *in_stack_fffffffffffffef8;
  allocator local_c1;
  string local_c0 [67];
  undefined1 local_7d;
  allocator local_69;
  string local_68 [72];
  ulong local_20;
  ConversionException *local_18;
  int64_t local_8;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  TVar1 = TryConvertTimestamp(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                              in_stack_fffffffffffffeb0,in_stack_fffffffffffffec8,
                              SUB81((ulong)in_stack_fffffffffffffea8 >> 0x38,0));
  switch(TVar1) {
  case SUCCESS:
  case STRICT_UTC:
    break;
  case ERROR_INCORRECT_FORMAT:
    uVar2 = __cxa_allocate_exception(0x10);
    paVar3 = &local_c1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_c0,(char *)local_18,local_20,paVar3);
    FormatError(in_stack_fffffffffffffef8);
    ConversionException::ConversionException(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    __cxa_throw(uVar2,&ConversionException::typeinfo,ConversionException::~ConversionException);
  case ERROR_NON_UTC_TIMEZONE:
    local_7d = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_68,(char *)local_18,local_20,&local_69);
    UnsupportedTimezoneError(in_stack_fffffffffffffef8);
    ConversionException::ConversionException(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    local_7d = 0;
    __cxa_throw(uVar2,&ConversionException::typeinfo,ConversionException::~ConversionException);
  case ERROR_RANGE:
    msg = (string *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffef8,(char *)local_18,local_20,&local_109);
    RangeError(in_stack_fffffffffffffef8);
    ConversionException::ConversionException(local_18,msg);
    __cxa_throw(msg,&ConversionException::typeinfo,ConversionException::~ConversionException);
  }
  return (timestamp_t)local_8;
}

Assistant:

timestamp_t Timestamp::FromCString(const char *str, idx_t len, optional_ptr<int32_t> nanos) {
	timestamp_t result;
	switch (Timestamp::TryConvertTimestamp(str, len, result, nanos)) {
	case TimestampCastResult::SUCCESS:
	case TimestampCastResult::STRICT_UTC:
		break;
	case TimestampCastResult::ERROR_NON_UTC_TIMEZONE:
		throw ConversionException(UnsupportedTimezoneError(string(str, len)));
	case TimestampCastResult::ERROR_INCORRECT_FORMAT:
		throw ConversionException(FormatError(string(str, len)));
	case TimestampCastResult::ERROR_RANGE:
		throw ConversionException(RangeError(string(str, len)));
	}
	return result;
}